

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txorphanage.cpp
# Opt level: O2

bool __thiscall TxOrphanage::AddTx(TxOrphanage *this,CTransactionRef *tx,NodeId peer)

{
  Wtxid *this_00;
  element_type *peVar1;
  pointer pCVar2;
  bool bVar3;
  size_type sVar4;
  size_t sVar5;
  size_t sVar6;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar7;
  _Rb_tree<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::_Identity<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>,TxOrphanage::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>
  *this_01;
  Level level;
  Wtxid *pWVar8;
  value_type *pvVar9;
  string *t;
  Txid *this_02;
  CTxIn *txin;
  pointer __k;
  long in_FS_OFFSET;
  bool bVar10;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  pair<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_bool>
  pVar11;
  size_t local_a8;
  size_t local_a0;
  uint sz;
  value_type local_90;
  undefined1 local_88;
  undefined1 local_80 [32];
  size_t local_60;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  peVar1 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = &peVar1->m_witness_hash;
  pWVar8 = this_00;
  sVar4 = std::
          map<transaction_identifier<true>,_TxOrphanage::OrphanTx,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
          ::count(&this->m_orphans,this_00);
  level = (Level)pWVar8;
  if (sVar4 == 0) {
    this_02 = &peVar1->hash;
    peVar1 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_80._0_8_ = &::TX_NO_WITNESS;
    local_80._8_8_ = peVar1;
    sVar5 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTransaction_const>>
                      ((ParamsWrapper<TransactionSerParams,_const_CTransaction> *)local_80);
    t = &local_58;
    local_58._M_dataplus._M_p = &::TX_WITH_WITNESS.allow_witness;
    local_58._M_string_length = (size_type)peVar1;
    sVar6 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTransaction_const>>
                      ((ParamsWrapper<TransactionSerParams,_const_CTransaction> *)t);
    sz = (int)sVar6 + (int)sVar5 * 3;
    bVar10 = sz < 0x61a81;
    if (bVar10) {
      std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_80,
                 &tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
      local_80._16_8_ = peer;
      tVar7 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                        ();
      local_80._24_8_ = (long)tVar7.__d.__r + 0x4b0;
      local_60 = (long)(this->m_orphan_list).
                       super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_orphan_list).
                       super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
      pVar11 = std::
               _Rb_tree<transaction_identifier<true>,std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>,std::_Select1st<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::less<transaction_identifier<true>>,std::allocator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>
               ::_M_emplace_unique<transaction_identifier<true>const&,TxOrphanage::OrphanTx>
                         ((_Rb_tree<transaction_identifier<true>,std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>,std::_Select1st<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::less<transaction_identifier<true>>,std::allocator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>
                           *)this,this_00,(OrphanTx *)local_80);
      local_90._M_node = (_Base_ptr)pVar11.first._M_node;
      local_88 = pVar11.second;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        __assert_fail("ret.second",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txorphanage.cpp"
                      ,0x25,"bool TxOrphanage::AddTx(const CTransactionRef &, NodeId)");
      }
      this_01 = (_Rb_tree<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::_Identity<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>,TxOrphanage::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>
                 *)&this->m_orphan_list;
      pvVar9 = &local_90;
      std::
      vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
      ::push_back((vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                   *)this_01,&local_90);
      peVar1 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pCVar2 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (__k = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start; __k != pCVar2; __k = __k + 1) {
        this_01 = (_Rb_tree<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::_Identity<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>,TxOrphanage::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>
                   *)std::
                     map<COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
                     ::operator[](&this->m_outpoint_to_orphan_it,&__k->prevout);
        pvVar9 = &local_90;
        std::
        _Rb_tree<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::_Identity<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>,TxOrphanage::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>
        ::
        _M_insert_unique<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>const&>
                  (this_01,&local_90);
      }
      bVar3 = ::LogAcceptCategory((LogFlags)this_01,(Level)pvVar9);
      if (!bVar3) goto LAB_0034dfd3;
      base_blob<256u>::ToString_abi_cxx11_((string *)local_80,(base_blob<256u> *)this_02);
      base_blob<256u>::ToString_abi_cxx11_(&local_58,(base_blob<256u> *)this_00);
      local_a0 = (this->m_orphans)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_a8 = (this->m_outpoint_to_orphan_it)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      logging_function_00._M_str = "AddTx";
      logging_function_00._M_len = 5;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txorphanage.cpp"
      ;
      source_file_00._M_len = 0x5f;
      LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,unsigned_int,unsigned_long,unsigned_long>
                (logging_function_00,source_file_00,0x2c,TXPACKAGES,Debug,
                 (ConstevalFormatString<5U>)0x6c27d4,(string *)local_80,&local_58,&sz,&local_a0,
                 &local_a8);
    }
    else {
      bVar3 = ::LogAcceptCategory((LogFlags)t,level);
      if (!bVar3) goto LAB_0034dfd3;
      base_blob<256u>::ToString_abi_cxx11_((string *)local_80,(base_blob<256u> *)this_02);
      base_blob<256u>::ToString_abi_cxx11_(&local_58,(base_blob<256u> *)this_00);
      logging_function._M_str = "AddTx";
      logging_function._M_len = 5;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txorphanage.cpp"
      ;
      source_file._M_len = 0x5f;
      LogPrintFormatInternal<unsigned_int,std::__cxx11::string,std::__cxx11::string>
                (logging_function,source_file,0x20,TXPACKAGES,Debug,
                 (ConstevalFormatString<3U>)0x6c2756,&sz,(string *)local_80,&local_58);
    }
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)local_80);
  }
  else {
    bVar10 = false;
  }
LAB_0034dfd3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar10;
  }
  __stack_chk_fail();
}

Assistant:

bool TxOrphanage::AddTx(const CTransactionRef& tx, NodeId peer)
{
    const Txid& hash = tx->GetHash();
    const Wtxid& wtxid = tx->GetWitnessHash();
    if (m_orphans.count(wtxid))
        return false;

    // Ignore big transactions, to avoid a
    // send-big-orphans memory exhaustion attack. If a peer has a legitimate
    // large transaction with a missing parent then we assume
    // it will rebroadcast it later, after the parent transaction(s)
    // have been mined or received.
    // 100 orphans, each of which is at most 100,000 bytes big is
    // at most 10 megabytes of orphans and somewhat more byprev index (in the worst case):
    unsigned int sz = GetTransactionWeight(*tx);
    if (sz > MAX_STANDARD_TX_WEIGHT)
    {
        LogDebug(BCLog::TXPACKAGES, "ignoring large orphan tx (size: %u, txid: %s, wtxid: %s)\n", sz, hash.ToString(), wtxid.ToString());
        return false;
    }

    auto ret = m_orphans.emplace(wtxid, OrphanTx{tx, peer, Now<NodeSeconds>() + ORPHAN_TX_EXPIRE_TIME, m_orphan_list.size()});
    assert(ret.second);
    m_orphan_list.push_back(ret.first);
    for (const CTxIn& txin : tx->vin) {
        m_outpoint_to_orphan_it[txin.prevout].insert(ret.first);
    }

    LogDebug(BCLog::TXPACKAGES, "stored orphan tx %s (wtxid=%s), weight: %u (mapsz %u outsz %u)\n", hash.ToString(), wtxid.ToString(), sz,
             m_orphans.size(), m_outpoint_to_orphan_it.size());
    return true;
}